

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToARGB4444Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  uint8_t a0_1;
  uint8_t r0_1;
  uint8_t g0_1;
  uint8_t b0_1;
  uint8_t a1;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  uint8_t a0;
  uint8_t r0;
  uint8_t g0;
  uint8_t b0;
  int x;
  int width_local;
  uint8_t *dst_rgb_local;
  uint8_t *src_argb_local;
  
  dst_rgb_local = dst_rgb;
  src_argb_local = src_argb;
  for (x = 0; x < width + -1; x = x + 2) {
    *(int *)dst_rgb_local =
         (int)(uint)*src_argb_local >> 4 | ((int)(uint)src_argb_local[1] >> 4) << 4 |
         ((int)(uint)src_argb_local[2] >> 4) << 8 | ((int)(uint)src_argb_local[3] >> 4) << 0xc |
         ((int)(uint)src_argb_local[4] >> 4) << 0x10 | ((int)(uint)src_argb_local[5] >> 4) << 0x14 |
         ((int)(uint)src_argb_local[6] >> 4) << 0x18 | ((int)(uint)src_argb_local[7] >> 4) << 0x1c;
    dst_rgb_local = dst_rgb_local + 4;
    src_argb_local = src_argb_local + 8;
  }
  if ((width & 1U) != 0) {
    *(ushort *)dst_rgb_local =
         (ushort)(byte)((int)(uint)*src_argb_local >> 4) |
         (ushort)(byte)((int)(uint)src_argb_local[1] >> 4) << 4 |
         (ushort)(byte)((int)(uint)src_argb_local[2] >> 4) << 8 |
         (ushort)(byte)((int)(uint)src_argb_local[3] >> 4) << 0xc;
  }
  return;
}

Assistant:

void ARGBToARGB4444Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb[0] >> 4;
    uint8_t g0 = src_argb[1] >> 4;
    uint8_t r0 = src_argb[2] >> 4;
    uint8_t a0 = src_argb[3] >> 4;
    uint8_t b1 = src_argb[4] >> 4;
    uint8_t g1 = src_argb[5] >> 4;
    uint8_t r1 = src_argb[6] >> 4;
    uint8_t a1 = src_argb[7] >> 4;
    *(uint32_t*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12) |
                            (b1 << 16) | (g1 << 20) | (r1 << 24) | (a1 << 28);
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8_t b0 = src_argb[0] >> 4;
    uint8_t g0 = src_argb[1] >> 4;
    uint8_t r0 = src_argb[2] >> 4;
    uint8_t a0 = src_argb[3] >> 4;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12);
  }
}